

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O3

void PrintBlock(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule,
               RegVmLoweredBlock *lowblock)

{
  VmBlock *pVVar1;
  char *pcVar2;
  RegVmLoweredInstruction *lowInstruction;
  byte *pbVar3;
  ulong uVar4;
  
  pVVar1 = lowblock->vmBlock;
  pcVar2 = (pVVar1->name).begin;
  PrintLine(ctx->output,"%.*s.b%d:",(ulong)(uint)(*(int *)&(pVVar1->name).end - (int)pcVar2),pcVar2,
            (ulong)pVVar1->uniqueId);
  if ((lowblock->entryRegisters).count != 0) {
    Print(ctx->output,"  // entry registers: [");
    if ((lowblock->entryRegisters).count != 0) {
      uVar4 = 0;
      do {
        if (uVar4 == 0) {
          pbVar3 = (lowblock->entryRegisters).data;
        }
        else {
          Print(ctx->output,", ");
          if ((lowblock->entryRegisters).count <= uVar4) goto LAB_00190ad7;
          pbVar3 = (lowblock->entryRegisters).data + uVar4;
        }
        Print(ctx->output,"r%d",(ulong)*pbVar3);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (lowblock->entryRegisters).count);
    }
    PrintLine(ctx->output,"]");
  }
  if ((lowblock->reservedRegisters).count != 0) {
    Print(ctx->output,"  // reserved registers: [");
    if ((lowblock->reservedRegisters).count != 0) {
      uVar4 = 0;
      do {
        if (uVar4 == 0) {
          pbVar3 = (lowblock->reservedRegisters).data;
        }
        else {
          Print(ctx->output,", ");
          if ((lowblock->reservedRegisters).count <= uVar4) goto LAB_00190ad7;
          pbVar3 = (lowblock->reservedRegisters).data + uVar4;
        }
        Print(ctx->output,"r%d",(ulong)*pbVar3);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (lowblock->reservedRegisters).count);
    }
    PrintLine(ctx->output,"]");
  }
  for (lowInstruction = lowblock->firstInstruction; lowInstruction != (RegVmLoweredInstruction *)0x0
      ; lowInstruction = lowInstruction->nextSibling) {
    OutputContext::Print(ctx->output,"  ",2);
    PrintInstruction(ctx,(char *)(lowModule->constants).data,lowInstruction);
  }
  if ((lowblock->exitRegisters).count != 0) {
    Print(ctx->output,"  // exit registers: [");
    if ((lowblock->exitRegisters).count != 0) {
      uVar4 = 0;
      do {
        if (uVar4 == 0) {
          pbVar3 = (lowblock->exitRegisters).data;
        }
        else {
          Print(ctx->output,", ");
          if ((lowblock->exitRegisters).count <= uVar4) {
LAB_00190ad7:
            __assert_fail("index < count",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x199,
                          "T &SmallArray<unsigned char, 16>::operator[](unsigned int) [T = unsigned char, N = 16]"
                         );
          }
          pbVar3 = (lowblock->exitRegisters).data + uVar4;
        }
        Print(ctx->output,"r%d",(ulong)*pbVar3);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (lowblock->exitRegisters).count);
    }
    PrintLine(ctx->output,"]");
  }
  if ((lowblock->lastInstruction != (RegVmLoweredInstruction *)0x0) &&
     ((uVar4 = (ulong)lowblock->lastInstruction->code, 0x22 < uVar4 ||
      ((0x4e0000000U >> (uVar4 & 0x3f) & 1) == 0)))) {
    PrintLine(ctx->output,"  // fallthrough");
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void PrintBlock(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule, RegVmLoweredBlock *lowblock)
{
	PrintLine(ctx.output, "%.*s.b%d:", FMT_ISTR(lowblock->vmBlock->name), lowblock->vmBlock->uniqueId);

	if(!lowblock->entryRegisters.empty())
	{
		Print(ctx.output, "  // entry registers: [");

		for(unsigned i = 0; i < lowblock->entryRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->entryRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	if(!lowblock->reservedRegisters.empty())
	{
		Print(ctx.output, "  // reserved registers: [");

		for(unsigned i = 0; i < lowblock->reservedRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->reservedRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	for(RegVmLoweredInstruction *lowInstruction = lowblock->firstInstruction; lowInstruction; lowInstruction = lowInstruction->nextSibling)
	{
		PrintIndent(ctx.output);
		PrintInstruction(ctx, (char*)lowModule->constants.data, lowInstruction);
	}

	if(!lowblock->exitRegisters.empty())
	{
		Print(ctx.output, "  // exit registers: [");

		for(unsigned i = 0; i < lowblock->exitRegisters.size(); i++)
		{
			if(i != 0)
				Print(ctx.output, ", ");

			Print(ctx.output, "r%d", lowblock->exitRegisters[i]);
		}

		PrintLine(ctx.output, "]");
	}

	if(lowblock->lastInstruction && !IsBlockTerminator(lowblock->lastInstruction))
		PrintLine(ctx.output, "  // fallthrough");

	PrintLine(ctx.output);
}